

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArray.H
# Opt level: O0

void __thiscall
amrex::FabArray<amrex::EBCellFlagFab>::FabArray
          (FabArray<amrex::EBCellFlagFab> *this,BoxArray *bxs,DistributionMapping *dm,int nvar,
          IntVect *ngrow,MFInfo *info,FabFactory<amrex::EBCellFlagFab> *factory)

{
  type pFVar1;
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  long *in_stack_00000008;
  pointer in_stack_ffffffffffffff38;
  FabArrayStats *in_stack_ffffffffffffff40;
  FabArrayBase *in_stack_ffffffffffffff50;
  
  FabArrayBase::FabArrayBase(in_stack_ffffffffffffff50);
  *in_RDI = (long)&PTR__FabArray_01aa2d90;
  (**(code **)(*in_stack_00000008 + 0x28))();
  std::
  unique_ptr<amrex::FabFactory<amrex::EBCellFlagFab>,std::default_delete<amrex::FabFactory<amrex::EBCellFlagFab>>>
  ::unique_ptr<std::default_delete<amrex::FabFactory<amrex::EBCellFlagFab>>,void>
            ((unique_ptr<amrex::FabFactory<amrex::EBCellFlagFab>,_std::default_delete<amrex::FabFactory<amrex::EBCellFlagFab>_>_>
              *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  DataAllocator::DataAllocator((DataAllocator *)(in_RDI + 0x1f));
  *(undefined1 *)(in_RDI + 0x20) = 0;
  std::vector<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>::vector
            ((vector<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_> *)0x141a115);
  in_RDI[0x24] = 0;
  MultiArray4<amrex::EBCellFlag>::MultiArray4((MultiArray4<amrex::EBCellFlag> *)(in_RDI + 0x25));
  MultiArray4<const_amrex::EBCellFlag>::MultiArray4
            ((MultiArray4<const_amrex::EBCellFlag> *)(in_RDI + 0x26));
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x141a158);
  ShMem::ShMem((ShMem *)(in_RDI + 0x2a));
  std::
  unique_ptr<amrex::FBData<amrex::EBCellFlagFab>,std::default_delete<amrex::FBData<amrex::EBCellFlagFab>>>
  ::unique_ptr<std::default_delete<amrex::FBData<amrex::EBCellFlagFab>>,void>
            ((unique_ptr<amrex::FBData<amrex::EBCellFlagFab>,_std::default_delete<amrex::FBData<amrex::EBCellFlagFab>_>_>
              *)in_stack_ffffffffffffff40);
  std::
  unique_ptr<amrex::PCData<amrex::EBCellFlagFab>,std::default_delete<amrex::PCData<amrex::EBCellFlagFab>>>
  ::unique_ptr<std::default_delete<amrex::PCData<amrex::EBCellFlagFab>>,void>
            ((unique_ptr<amrex::PCData<amrex::EBCellFlagFab>,_std::default_delete<amrex::PCData<amrex::EBCellFlagFab>_>_>
              *)in_stack_ffffffffffffff40);
  std::
  unique_ptr<amrex::FabArray<amrex::EBCellFlagFab>,std::default_delete<amrex::FabArray<amrex::EBCellFlagFab>>>
  ::unique_ptr<std::default_delete<amrex::FabArray<amrex::EBCellFlagFab>>,void>
            ((unique_ptr<amrex::FabArray<amrex::EBCellFlagFab>,_std::default_delete<amrex::FabArray<amrex::EBCellFlagFab>_>_>
              *)in_stack_ffffffffffffff40);
  FabArrayBase::FabArrayStats::recordBuild(in_stack_ffffffffffffff40);
  pFVar1 = std::
           unique_ptr<amrex::FabFactory<amrex::EBCellFlagFab>,_std::default_delete<amrex::FabFactory<amrex::EBCellFlagFab>_>_>
           ::operator*((unique_ptr<amrex::FabFactory<amrex::EBCellFlagFab>,_std::default_delete<amrex::FabFactory<amrex::EBCellFlagFab>_>_>
                        *)in_stack_ffffffffffffff40);
  (**(code **)(*in_RDI + 0x18))(in_RDI,in_RSI,in_RDX,in_ECX,in_R8,in_R9,pFVar1);
  return;
}

Assistant:

FabArray<FAB>::FabArray (const BoxArray&            bxs,
                         const DistributionMapping& dm,
                         int                        nvar,
                         const IntVect&             ngrow,
                         const MFInfo&              info,
                         const FabFactory<FAB>&     factory)
    : m_factory(factory.clone()),
      shmem()
{
    m_FA_stats.recordBuild();
    define(bxs,dm,nvar,ngrow,info,*m_factory);
}